

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O3

void ST_LoadCrosshair(bool alwaysload)

{
  long lVar1;
  uint uVar2;
  FTextureID FVar3;
  uint uVar4;
  char name [16];
  char acStack_38 [24];
  
  if (!crosshairforce.Value) {
    lVar1 = (&DAT_017e1fb8)[(long)consoleplayer * 0x54];
    if (lVar1 != 0) {
      if ((*(byte *)(lVar1 + 0x20) & 0x20) == 0) {
        if (((*(long *)(lVar1 + 0x230) != 0) &&
            (lVar1 = *(long *)(*(long *)(lVar1 + 0x230) + 0xd0), lVar1 != 0)) &&
           (uVar4 = *(uint *)(lVar1 + 0x59c), uVar4 != 0)) goto LAB_004cd8aa;
      }
      else {
        (&DAT_017e1fb8)[(long)consoleplayer * 0x54] = 0;
      }
    }
  }
  uVar4 = crosshair.Value;
LAB_004cd8aa:
  if ((alwaysload) || (CrosshairNum != uVar4 || CrosshairImage == (FTexture *)0x0)) {
    if (CrosshairImage != (FTexture *)0x0) {
      (*CrosshairImage->_vptr_FTexture[9])();
    }
    if (uVar4 == 0) {
      CrosshairNum = 0;
    }
    else {
      uVar2 = -uVar4;
      if (0 < (int)uVar4) {
        uVar2 = uVar4;
      }
      uVar4 = 0x42;
      if ((screen->super_DSimpleCanvas).super_DCanvas.Width < 0x280) {
        uVar4 = 0x53;
      }
      mysnprintf(acStack_38,0x10,"XHAIR%c%d",(ulong)uVar4,(ulong)uVar2);
      FVar3 = FTextureManager::CheckForTexture(&TexMan,acStack_38,8,0x11);
      if (FVar3.texnum < 1) {
        mysnprintf(acStack_38,0x10,"XHAIR%c1",(ulong)uVar4);
        FVar3 = FTextureManager::CheckForTexture(&TexMan,acStack_38,8,0x11);
        if (FVar3.texnum < 1) {
          FVar3 = FTextureManager::CheckForTexture(&TexMan,"XHAIRS1",8,0x11);
        }
      }
      CrosshairNum = uVar2;
      if ((uint)FVar3.texnum < TexMan.Textures.Count) {
        CrosshairImage = TexMan.Textures.Array[FVar3.texnum].Texture;
        return;
      }
    }
    CrosshairImage = (FTexture *)0x0;
  }
  return;
}

Assistant:

void ST_LoadCrosshair(bool alwaysload)
{
	int num = 0;
	char name[16], size;

	if (!crosshairforce &&
		players[consoleplayer].camera != NULL &&
		players[consoleplayer].camera->player != NULL &&
		players[consoleplayer].camera->player->ReadyWeapon != NULL)
	{
		num = players[consoleplayer].camera->player->ReadyWeapon->Crosshair;
	}
	if (num == 0)
	{
		num = crosshair;
	}
	if (!alwaysload && CrosshairNum == num && CrosshairImage != NULL)
	{ // No change.
		return;
	}

	if (CrosshairImage != NULL)
	{
		CrosshairImage->Unload ();
	}
	if (num == 0)
	{
		CrosshairNum = 0;
		CrosshairImage = NULL;
		return;
	}
	if (num < 0)
	{
		num = -num;
	}
	size = (SCREENWIDTH < 640) ? 'S' : 'B';

	mysnprintf (name, countof(name), "XHAIR%c%d", size, num);
	FTextureID texid = TexMan.CheckForTexture(name, FTexture::TEX_MiscPatch, FTextureManager::TEXMAN_TryAny | FTextureManager::TEXMAN_ShortNameOnly);
	if (!texid.isValid())
	{
		mysnprintf (name, countof(name), "XHAIR%c1", size);
		texid = TexMan.CheckForTexture(name, FTexture::TEX_MiscPatch, FTextureManager::TEXMAN_TryAny | FTextureManager::TEXMAN_ShortNameOnly);
		if (!texid.isValid())
		{
			texid = TexMan.CheckForTexture("XHAIRS1", FTexture::TEX_MiscPatch, FTextureManager::TEXMAN_TryAny | FTextureManager::TEXMAN_ShortNameOnly);
		}
	}
	CrosshairNum = num;
	CrosshairImage = TexMan[texid];
}